

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::CreateThread<vkt::api::(anonymous_namespace)::Device>::runThread
          (CreateThread<vkt::api::(anonymous_namespace)::Device> *this)

{
  RefData<vk::VkDevice_s_*> data;
  int iVar1;
  Move<vk::VkDevice_s_*> local_68;
  RefData<vk::VkDevice_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkDevice_s_*> obj;
  int iterNdx;
  int itersBetweenSyncs;
  int numIters;
  CreateThread<vkt::api::(anonymous_namespace)::Device> *this_local;
  
  iVar1 = getCreateCount<vkt::api::(anonymous_namespace)::Device>();
  for (obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ = 0;
      obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ < iVar1;
      obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ =
           obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ + 1) {
    if (obj.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._4_4_ % (iVar1 / 5) == 0) {
      ThreadGroupThread::barrier(&this->super_ThreadGroupThread);
    }
    Device::create(&local_68,this->m_env,this->m_resources,this->m_params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
    data.deleter.m_destroyDevice = local_50.deleter.m_destroyDevice;
    data.object = local_50.object;
    data.deleter.m_allocator = local_50.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_38,data);
    ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_68);
    ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_38);
  }
  return;
}

Assistant:

void runThread (void)
	{
		const int	numIters			= getCreateCount<Object>();
		const int	itersBetweenSyncs	= numIters / 5;

		DE_ASSERT(itersBetweenSyncs > 0);

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			// Sync every Nth iteration to make entering driver at the same time more likely
			if ((iterNdx % itersBetweenSyncs) == 0)
				barrier();

			{
				Unique<typename Object::Type>	obj	(Object::create(m_env, m_resources, m_params));
			}
		}
	}